

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_IESV_SingleExportFileMustPass_Test::
~InterpreterTestSuite_IESV_SingleExportFileMustPass_Test
          (InterpreterTestSuite_IESV_SingleExportFileMustPass_Test *this)

{
  InterpreterTestSuite_IESV_SingleExportFileMustPass_Test *this_local;
  
  ~InterpreterTestSuite_IESV_SingleExportFileMustPass_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, IESV_SingleExportFileMustPass)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    expr = ctx.mInterpreter.ParseExpression("br scan --timeout 1 --export ./2.json");

    Interpreter::Value value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}